

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

void __thiscall wirehair::Codec::InitializeColumnValues(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  PeelRow *pPVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  ushort uVar7;
  uint uVar8;
  uint8_t *__s;
  ushort uVar9;
  uint8_t *__src;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  short sVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  
  uVar9 = this->_dense_count + this->_defer_count;
  uVar7 = this->_defer_count + this->_mix_count;
  if (uVar7 != 0) {
    uVar14 = 0;
    do {
      uVar15 = this->_block_bytes;
      uVar11 = this->_ge_col_map[uVar14];
      uVar1 = this->_pivots[uVar14];
      __s = this->_recovery_blocks + uVar15 * uVar11;
      if ((uVar1 < this->_dense_count) || ((uint)this->_extra_count + (uint)uVar9 <= (uint)uVar1)) {
        memset(__s,0,(ulong)uVar15);
        this->_ge_row_map[uVar1] = uVar11;
      }
      else {
        uVar2 = this->_block_count;
        pPVar4 = this->_peel_rows;
        uVar11 = this->_ge_row_map[uVar1];
        __src = this->_input_blocks + uVar15 * uVar11;
        if (uVar2 - 1 == (uint)uVar11) {
          memcpy(__s,__src,(ulong)this->_input_final_bytes);
          memset(__s + this->_input_final_bytes,0,
                 (ulong)(this->_block_bytes - this->_input_final_bytes));
          uVar2 = this->_block_count;
          __src = (uint8_t *)0x0;
        }
        uVar1 = this->_block_next_prime;
        uVar10 = (ulong)pPVar4[uVar11].Params.PeelFirst;
        uVar3 = pPVar4[uVar11].Params.PeelAdd;
        uVar15 = (uint)uVar3;
        sVar13 = pPVar4[uVar11].Params.PeelCount - 1;
        while( true ) {
          iVar16 = (int)(uVar10 & 0xffff);
          if (this->_peel_cols[uVar10 & 0xffff].Mark == '\x01') {
            uVar8 = this->_block_bytes;
            if (__src == (uint8_t *)0x0) {
              gf256_add_mem(__s,this->_recovery_blocks + uVar8 * iVar16,uVar8);
            }
            else {
              gf256_addset_mem(__s,__src,this->_recovery_blocks + uVar8 * iVar16,uVar8);
            }
            __src = (uint8_t *)0x0;
          }
          bVar17 = sVar13 == 0;
          sVar13 = sVar13 + -1;
          if (bVar17) break;
          uVar10 = (ulong)(iVar16 + (uint)uVar3) % (ulong)uVar1;
          if ((uint)uVar2 <= (uint)uVar10) {
            uVar8 = (uint)uVar1 - (uint)uVar10;
            uVar12 = uVar8 & 0xffff;
            if (uVar3 < (ushort)uVar8) {
              uVar10 = (ulong)(uVar15 * 0x10000 - uVar12) % (ulong)uVar15;
            }
            else {
              uVar10 = (ulong)(uVar15 - uVar12);
            }
          }
        }
        if (__src != (uint8_t *)0x0) {
          memcpy(__s,__src,(ulong)this->_block_bytes);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar7);
  }
  uVar15 = this->_pivot_count;
  if (uVar7 < uVar15) {
    puVar5 = this->_pivots;
    puVar6 = this->_ge_row_map;
    uVar11 = uVar7;
    do {
      uVar1 = puVar5[uVar11];
      if ((uVar1 < this->_dense_count) || (uVar1 < uVar7 && uVar9 <= uVar1)) {
        puVar6[uVar1] = 0xffff;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar15);
  }
  return;
}

Assistant:

void Codec::InitializeColumnValues()
{
    CAT_IF_DUMP(cout << endl << "---- InitializeColumnValues ----" << endl << endl;)

    CAT_IF_ROWOP(uint32_t rowops = 0;)

    const uint16_t first_heavy_row = _defer_count + _dense_count;
    const uint16_t column_count = _defer_count + _mix_count;

    uint16_t pivot_i;

    // For each pivot:
    for (pivot_i = 0; pivot_i < column_count; ++pivot_i)
    {
        // Lookup pivot column, GE row, and destination buffer
        const uint16_t dest_column_i = _ge_col_map[pivot_i];
        const uint16_t ge_row_i = _pivots[pivot_i];
        CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);
        uint8_t * GF256_RESTRICT buffer_dest = _recovery_blocks + _block_bytes * dest_column_i;

        CAT_IF_DUMP(cout << "Pivot " << pivot_i << " solving column " << dest_column_i << " with GE row " << ge_row_i << " : ";)

        // If it is a dense/heavy(non-extra) row,
        if (ge_row_i < _dense_count ||
            ge_row_i >= (first_heavy_row + _extra_count))
        {
            // Dense/heavy rows sum to zero
            memset(buffer_dest, 0, _block_bytes);

            // Store which column solves the dense row
            _ge_row_map[ge_row_i] = dest_column_i;

            CAT_IF_DUMP(cout << "[0]" << endl;)
            CAT_IF_ROWOP(++rowops;)

            continue;
        }

        // Look up row and input value for GE row
        const uint16_t row_i = _ge_row_map[ge_row_i];
        const uint8_t * GF256_RESTRICT combo = _input_blocks + _block_bytes * row_i;
        PeelRow * GF256_RESTRICT row = &_peel_rows[row_i];

        CAT_IF_DUMP(cout << "[" << (unsigned)combo[0] << "]";)

        // If copying from final input block:
        if (row_i == _block_count - 1)
        {
            memcpy(buffer_dest, combo, _input_final_bytes);
            memset(buffer_dest + _input_final_bytes, 0, _block_bytes - _input_final_bytes);

            CAT_IF_ROWOP(++rowops;)

            combo = 0;
        }

        PeelRowIterator iter(row->Params, _block_count, _block_next_prime);

        // Eliminate peeled columns:
        do
        {
            const uint16_t column_i = iter.GetColumn();

            PeelColumn * GF256_RESTRICT column = &_peel_cols[column_i];

            // If column is peeled:
            if (column->Mark == MARK_PEEL)
            {
                CAT_DEBUG_ASSERT(column_i < _recovery_rows);
                const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * column_i;

                // If combo unused:
                if (!combo) {
                    gf256_add_mem(buffer_dest, src, _block_bytes);
                }
                else
                {
                    // Use combo
                    gf256_addset_mem(buffer_dest, combo, src, _block_bytes);

                    combo = 0;
                }
                CAT_IF_ROWOP(++rowops;)
            }
        } while (iter.Iterate());

        // If combo still unused:
        if (combo) {
            memcpy(buffer_dest, combo, _block_bytes);
        }

        CAT_IF_DUMP(cout << endl;)
    }

    // For each remaining pivot:
    for (; pivot_i < _pivot_count; ++pivot_i)
    {
        const uint16_t ge_row_i = _pivots[pivot_i];

        // If row is a dense row,
        if (ge_row_i < _dense_count ||
            (ge_row_i >= first_heavy_row && ge_row_i < column_count))
        {
            // Mark it for skipping
            _ge_row_map[ge_row_i] = LIST_TERM;

            CAT_IF_DUMP(cout << "Did not use GE row " << ge_row_i << ", which is a dense row." << endl;)
        }
        else {
            CAT_IF_DUMP(cout << "Did not use deferred row " << ge_row_i << ", which is not a dense row." << endl;)
        }
    }

    CAT_IF_ROWOP(cout << "InitializeColumnValues used " << rowops << " row ops = " << rowops / (double)_block_count << "*N" << endl;)
}